

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall
TPZMatrix<Fad<double>_>::PutSub
          (TPZMatrix<Fad<double>_> *this,int64_t sRow,int64_t sCol,TPZFMatrix<Fad<double>_> *A)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long local_70;
  Fad<double> local_50;
  
  lVar2 = (this->super_TPZBaseMatrix).fRow;
  if (lVar2 <= sRow) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"incompatible dimensions",0x17);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.cpp"
               ,0x1e4);
  }
  lVar2 = lVar2 - sRow;
  lVar1 = (A->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  lVar3 = (A->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol;
  if (lVar1 < lVar2) {
    lVar2 = lVar1;
  }
  lVar1 = (this->super_TPZBaseMatrix).fCol - sCol;
  if (lVar3 < lVar1) {
    lVar1 = lVar3;
  }
  if (0 < lVar2) {
    lVar3 = 0;
    local_70 = sRow;
    do {
      if (0 < lVar1) {
        lVar4 = 0;
        do {
          (*(A->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x24])(&local_50,A,lVar3,lVar4);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,local_70,sCol + lVar4,&local_50);
          Fad<double>::~Fad(&local_50);
          lVar4 = lVar4 + 1;
        } while (lVar1 != lVar4);
      }
      lVar3 = lVar3 + 1;
      local_70 = local_70 + 1;
    } while (lVar3 != lVar2);
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::PutSub(const int64_t sRow,const int64_t sCol,const TPZFMatrix<TVar> &A ) {
    if(sRow >= this->Rows()){
        LOGPZ_ERROR(logger,"incompatible dimensions")
        DebugStop();
    }

    int64_t minRow = MIN( A.Rows(), Rows() - sRow );
    int64_t minCol = MIN( A.Cols(), Cols() - sCol );
	
    int64_t row = sRow;
    for ( int64_t r = 0; r < minRow; r++, row++ ) {
        int64_t col = sCol;
        for ( int64_t c = 0; c < minCol; c++, col++ ) {
            PutVal( row, col, A.GetVal( r, c ) );
        }
    }
    return( 1 );
}